

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_group_ops
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  long *plVar6;
  long lVar7;
  int *piVar8;
  size_t sVar9;
  Allocator *pAVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  byte bVar26;
  int i;
  pointer ppLVar27;
  Layer *pLVar28;
  long lVar29;
  _func_int *p_Var30;
  ulong uVar31;
  int iVar32;
  pointer __arg;
  void *pvVar33;
  long lVar34;
  bool bVar35;
  ushort uVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  ParamDict pd;
  int local_290;
  int local_28c;
  Mat local_288;
  int local_23c;
  Mat local_238;
  void *local_1f0;
  int *piStack_1e8;
  size_t local_1e0;
  int local_1d8;
  Allocator *local_1d0;
  undefined8 local_1c8;
  ulong uStack_1c0;
  uint local_1b8;
  size_t local_1b0;
  void *local_1a8;
  int *piStack_1a0;
  size_t local_198;
  int local_190;
  Allocator *local_188;
  undefined8 local_180;
  ulong uStack_178;
  uint local_170;
  size_t local_168;
  void *local_160;
  int *piStack_158;
  long lStack_150;
  undefined4 uStack_148;
  long *local_140;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined8 local_120;
  void *local_118;
  int *piStack_110;
  long lStack_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined8 local_d8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_c8;
  size_t local_c0;
  Allocator *local_b8;
  size_t local_b0;
  ParamDict local_a8;
  Mat local_98;
  size_t local_50;
  undefined1 *local_48;
  size_t local_40;
  Option *local_38;
  
  __arg = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
          _M_impl.super__Vector_impl_data._M_start;
  p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
  iVar32 = *(int *)(&this->field_0xd8 + (long)p_Var30) * *(int *)(&this->field_0xd4 + (long)p_Var30)
  ;
  iVar2 = *(int *)(&this->field_0xd0 + (long)p_Var30);
  iVar3 = *(int *)(&this->field_0x108 + (long)p_Var30);
  uVar31 = (long)*(int *)(&this->field_0x104 + (long)p_Var30) / (long)iVar3;
  uVar31 = (long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | uVar31 & 0xffffffff) / (long)iVar32;
  ppLVar27 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_38 = opt;
  if (0 < (int)((ulong)((long)ppLVar27 - (long)__arg) >> 3)) {
    lVar34 = 0;
    do {
      if (__arg[lVar34] != (Layer *)0x0) {
        (*__arg[lVar34]->_vptr_Layer[1])();
        __arg = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
        ppLVar27 = (this->group_ops).
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 < (int)((ulong)((long)ppLVar27 - (long)__arg) >> 3));
  }
  local_c8 = &this->group_ops;
  if (ppLVar27 != __arg) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = __arg;
  }
  iVar4 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_c8,(long)iVar4);
  if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3])) {
    local_48 = &this->field_0x118;
    local_23c = iVar32 * i *
                (((int)((long)((ulong)(uint)((int)uVar31 >> 0x1f) << 0x20 | uVar31 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_40 = (size_t)local_23c;
    local_50 = (size_t)i;
    p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
    lVar34 = 0;
    do {
      local_238.elemsize = *(size_t *)(&this->field_0x178 + (long)p_Var30);
      local_238.data =
           (void *)(lVar34 * local_40 * local_238.elemsize +
                   *(long *)(&this->field_0x168 + (long)p_Var30));
      local_238.elempack = *(int *)(&this->field_0x180 + (long)p_Var30);
      local_238.allocator = *(Allocator **)(&this->field_0x188 + (long)p_Var30);
      local_238.refcount = (int *)0x0;
      local_238.w = (int)local_40;
      local_238.dims = 1;
      local_238.h = 1;
      local_238.d = 1;
      local_238.c = 1;
      local_238.cstep = local_40;
      Mat::clone(&local_98,(__fn *)&local_238,(void *)0x0,1,__arg);
      if (local_238.refcount != (int *)0x0) {
        LOCK();
        *local_238.refcount = *local_238.refcount + -1;
        UNLOCK();
        if (*local_238.refcount == 0) {
          if (local_238.allocator == (Allocator *)0x0) {
            if (local_238.data != (void *)0x0) {
              free(local_238.data);
            }
          }
          else {
            (*(local_238.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
      bVar35 = *(int *)(&this->field_0x100 + (long)p_Var30) == 0;
      if (bVar35) {
        pvVar33 = (void *)0x0;
        local_b0 = 0;
        local_28c = 0;
        local_b8 = (Allocator *)0x0;
        local_290 = 0;
        local_c0 = 0;
      }
      else {
        local_b0 = *(size_t *)(&this->field_0x1c0 + (long)p_Var30);
        pvVar33 = (void *)(lVar34 * local_50 * local_b0 +
                          *(long *)(&this->field_0x1b0 + (long)p_Var30));
        local_28c = *(int *)(&this->field_0x1c8 + (long)p_Var30);
        local_b8 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var30);
        local_c0 = local_50;
        local_290 = i;
      }
      bVar35 = !bVar35;
      pLVar28 = create_layer(6);
      ParamDict::ParamDict(&local_a8);
      ParamDict::set(&local_a8,0,i);
      ParamDict::set(&local_a8,1,
                     *(int *)(&this->field_0xd4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,0xb,
                     *(int *)(&this->field_0xd8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,2,
                     *(int *)(&this->field_0xdc +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,0xc,
                     *(int *)(&this->field_0xe0 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,3,
                     *(int *)(&this->field_0xe4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,0xd,
                     *(int *)(&this->field_0xe8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,4,0);
      ParamDict::set(&local_a8,0xe,0);
      ParamDict::set(&local_a8,5,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,6,local_23c);
      ParamDict::set(&local_a8,8,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,9,
                     *(int *)(&this->field_0x110 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      ParamDict::set(&local_a8,10,
                     (Mat *)(local_48 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]));
      (*pLVar28->_vptr_Layer[2])(pLVar28,&local_a8);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_avx512[-3]) == 0)
      {
        lVar29 = 0x40;
        do {
          *(undefined8 *)((long)&local_238.data + lVar29) = 0;
          *(undefined1 (*) [16])((long)&local_288.elemsize + lVar29) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(&local_288.field_0x1c + lVar29) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_288.h + lVar29) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(&local_288.field_0x3c + lVar29) = (undefined1  [16])0x0;
          lVar29 = lVar29 + 0x48;
        } while (lVar29 != 0x160);
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        if (local_238.refcount != (int *)0x0) {
          LOCK();
          *local_238.refcount = *local_238.refcount + -1;
          UNLOCK();
          if (*local_238.refcount == 0) {
            if (local_238.allocator == (Allocator *)0x0) {
              if (local_238.data != (void *)0x0) {
                free(local_238.data);
              }
            }
            else {
              (*(local_238.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_238.data = local_98.data;
        local_238.refcount = local_98.refcount;
        local_238.elemsize = local_98.elemsize;
        local_238.elempack = local_98.elempack;
        local_238.allocator = local_98.allocator;
        local_238.dims = local_98.dims;
        local_238.w = local_98.w;
        local_238.h = local_98.h;
        local_238.d = local_98.d;
        local_238.c = local_98.c;
        local_238.cstep = local_98.cstep;
        p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
        if (*(int *)(&this->field_0x10c + (long)p_Var30) != 0) {
          local_288.cstep = 0;
          local_288.data = (void *)0x0;
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize = 0;
          local_288.elempack = 0;
          local_288.h = 0;
          local_288.d = 0;
          local_288.c = 0;
          local_288.allocator = (Allocator *)0x0;
          local_288.dims = 0;
          local_288.w = 0;
          Mat::create(&local_288,i,4,(Allocator *)0x0);
          auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < local_288.c * (int)local_288.cstep) {
            auVar39 = vpbroadcastq_avx512f();
            auVar40 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)(*(long *)(&this->field_0x1f8 +
                                                            (long)this->
                                                  _vptr_ConvolutionDepthWise_x86_avx512[-3]) +
                                                  lVar34 * 4)));
            uVar31 = 0;
            do {
              auVar41 = vpbroadcastq_avx512f();
              auVar42 = vporq_avx512f(auVar41,auVar37);
              auVar41 = vporq_avx512f(auVar41,auVar38);
              uVar24 = vpcmpuq_avx512f(auVar41,auVar39,2);
              uVar25 = vpcmpuq_avx512f(auVar42,auVar39,2);
              bVar26 = (byte)uVar25;
              uVar36 = CONCAT11(bVar26,(byte)uVar24);
              puVar1 = (uint *)((long)local_288.data + uVar31 * 4);
              bVar35 = (bool)((byte)uVar24 & 1);
              bVar11 = (bool)((byte)(uVar36 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar36 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar36 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar36 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar36 >> 6) & 1);
              bVar17 = (bool)((byte)(uVar36 >> 7) & 1);
              bVar18 = (bool)(bVar26 >> 1 & 1);
              bVar19 = (bool)(bVar26 >> 2 & 1);
              bVar20 = (bool)(bVar26 >> 3 & 1);
              bVar21 = (bool)(bVar26 >> 4 & 1);
              bVar22 = (bool)(bVar26 >> 5 & 1);
              bVar23 = (bool)(bVar26 >> 6 & 1);
              *puVar1 = (uint)bVar35 * auVar40._0_4_ | (uint)!bVar35 * *puVar1;
              puVar1[1] = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * puVar1[1];
              puVar1[2] = (uint)bVar12 * auVar40._8_4_ | (uint)!bVar12 * puVar1[2];
              puVar1[3] = (uint)bVar13 * auVar40._12_4_ | (uint)!bVar13 * puVar1[3];
              puVar1[4] = (uint)bVar14 * auVar40._16_4_ | (uint)!bVar14 * puVar1[4];
              puVar1[5] = (uint)bVar15 * auVar40._20_4_ | (uint)!bVar15 * puVar1[5];
              puVar1[6] = (uint)bVar16 * auVar40._24_4_ | (uint)!bVar16 * puVar1[6];
              puVar1[7] = (uint)bVar17 * auVar40._28_4_ | (uint)!bVar17 * puVar1[7];
              puVar1[8] = (uint)(bVar26 & 1) * auVar40._32_4_ |
                          (uint)!(bool)(bVar26 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar18 * auVar40._36_4_ | (uint)!bVar18 * puVar1[9];
              puVar1[10] = (uint)bVar19 * auVar40._40_4_ | (uint)!bVar19 * puVar1[10];
              puVar1[0xb] = (uint)bVar20 * auVar40._44_4_ | (uint)!bVar20 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar21 * auVar40._48_4_ | (uint)!bVar21 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar22 * auVar40._52_4_ | (uint)!bVar22 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar23 * auVar40._56_4_ | (uint)!bVar23 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar26 >> 7) * auVar40._60_4_ |
                            (uint)!(bool)(bVar26 >> 7) * puVar1[0xf];
              uVar31 = uVar31 + 0x10;
            } while ((local_288.c * (int)local_288.cstep + 0xfU & 0xfffffff0) != uVar31);
          }
          piVar8 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          if (piStack_1e8 != (int *)0x0) {
            LOCK();
            *piStack_1e8 = *piStack_1e8 + -1;
            UNLOCK();
            if (*piStack_1e8 == 0) {
              if (local_1d0 == (Allocator *)0x0) {
                if (local_1f0 != (void *)0x0) {
                  free(local_1f0);
                }
              }
              else {
                (*local_1d0->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1e8 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_1f0 = local_288.data;
          local_1e0 = local_288.elemsize;
          local_1d8 = local_288.elempack;
          local_1d0 = local_288.allocator;
          local_1c8 = CONCAT44(local_288.w,local_288.dims);
          uStack_1c0._0_4_ = local_288.h;
          uStack_1c0._4_4_ = local_288.d;
          local_1b8 = local_288.c;
          local_1b0 = local_288.cstep;
          p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
          sVar9 = *(size_t *)(&this->field_0x250 + (long)p_Var30);
          pvVar33 = (void *)(sVar9 * lVar34 + *(long *)(&this->field_0x240 + (long)p_Var30));
          iVar2 = *(int *)(&this->field_0x258 + (long)p_Var30);
          pAVar10 = *(Allocator **)(&this->field_0x260 + (long)p_Var30);
          if (piStack_1a0 != (int *)0x0) {
            LOCK();
            *piStack_1a0 = *piStack_1a0 + -1;
            UNLOCK();
            if (*piStack_1a0 == 0) {
              if (local_188 == (Allocator *)0x0) {
                if (local_1a8 != (void *)0x0) {
                  free(local_1a8);
                }
              }
              else {
                (*local_188->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1a0 = (int *)0x0;
          local_180 = 0x100000001;
          uStack_178 = 0x100000001;
          local_170 = 1;
          local_168 = 1;
          piVar8 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_1a8 = pvVar33;
          local_198 = sVar9;
          local_190 = iVar2;
          local_188 = pAVar10;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_288.allocator == (Allocator *)0x0) {
                if (local_288.data != (void *)0x0) {
                  free(local_288.data);
                }
              }
              else {
                (*(local_288.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
        }
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var30)) {
          lVar29 = *(long *)(&this->field_0x298 + (long)p_Var30);
          lVar7 = *(long *)(&this->field_0x288 + (long)p_Var30);
          uVar5 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var30);
          plVar6 = *(long **)(&this->field_0x2a8 + (long)p_Var30);
          if (piStack_158 != (int *)0x0) {
            LOCK();
            *piStack_158 = *piStack_158 + -1;
            UNLOCK();
            if (*piStack_158 == 0) {
              if (local_140 == (long *)0x0) {
                if (local_160 != (void *)0x0) {
                  free(local_160);
                }
              }
              else {
                (**(code **)(*local_140 + 0x18))();
              }
            }
          }
          piStack_158 = (int *)0x0;
          local_138 = 1;
          uStack_134 = 1;
          uStack_130 = 1;
          uStack_12c = 1;
          local_128 = 1;
          local_120 = 1;
          local_160 = (void *)(lVar29 * lVar34 + lVar7);
          lStack_150 = lVar29;
          uStack_148 = uVar5;
          local_140 = plVar6;
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_238);
        (*pLVar28->_vptr_Layer[3])(pLVar28,&local_288);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
        lVar29 = 0xd8;
        do {
          piVar8 = *(int **)((long)&local_238.refcount + lVar29);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              pvVar33 = *(void **)((long)&local_238.data + lVar29);
              plVar6 = *(long **)((long)&local_238.allocator + lVar29);
              if (plVar6 == (long *)0x0) {
                if (pvVar33 != (void *)0x0) {
                  free(pvVar33);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_238.cstep + lVar29) = 0;
          *(undefined1 (*) [16])((long)&local_238.refcount + lVar29 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_238.data + lVar29) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_238.dims + lVar29) = (undefined1  [16])0x0;
          *(undefined4 *)((long)&local_238.c + lVar29) = 0;
          lVar29 = lVar29 + -0x48;
        } while (lVar29 != -0x48);
      }
      else {
        lVar29 = 0x40;
        do {
          *(undefined8 *)((long)&local_238.data + lVar29) = 0;
          *(undefined1 (*) [16])((long)&local_288.elemsize + lVar29) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(&local_288.field_0x1c + lVar29) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_288.h + lVar29) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(&local_288.field_0x3c + lVar29) = (undefined1  [16])0x0;
          lVar29 = lVar29 + 0x48;
        } while (lVar29 != 0x1a8);
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + 1;
          UNLOCK();
        }
        if (local_238.refcount != (int *)0x0) {
          LOCK();
          *local_238.refcount = *local_238.refcount + -1;
          UNLOCK();
          if (*local_238.refcount == 0) {
            if (local_238.allocator == (Allocator *)0x0) {
              if (local_238.data != (void *)0x0) {
                free(local_238.data);
              }
            }
            else {
              (*(local_238.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_238.data = local_98.data;
        local_238.refcount = local_98.refcount;
        local_238.elemsize = local_98.elemsize;
        local_238.elempack = local_98.elempack;
        local_238.allocator = local_98.allocator;
        local_238.dims = local_98.dims;
        local_238.w = local_98.w;
        local_238.h = local_98.h;
        local_238.d = local_98.d;
        local_238.c = local_98.c;
        local_238.cstep = local_98.cstep;
        if (piStack_1e8 != (int *)0x0) {
          LOCK();
          *piStack_1e8 = *piStack_1e8 + -1;
          UNLOCK();
          if (*piStack_1e8 == 0) {
            if (local_1d0 == (Allocator *)0x0) {
              if (local_1f0 != (void *)0x0) {
                free(local_1f0);
              }
            }
            else {
              (*local_1d0->_vptr_Allocator[3])();
            }
          }
        }
        piStack_1e8 = (int *)0x0;
        local_1e0 = local_b0;
        local_1d8 = local_28c;
        local_1d0 = local_b8;
        local_1b8 = (uint)bVar35;
        local_1c8 = CONCAT44(local_290,local_1b8);
        uStack_1c0 = (ulong)CONCAT14(bVar35,local_1b8);
        local_1b0 = local_c0;
        p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
        local_1f0 = pvVar33;
        if (*(int *)(&this->field_0x10c + (long)p_Var30) != 0) {
          local_288.cstep = 0;
          local_288.data = (void *)0x0;
          local_288.refcount._0_4_ = 0;
          local_288.refcount._4_4_ = 0;
          local_288.elemsize = 0;
          local_288.elempack = 0;
          local_288.h = 0;
          local_288.d = 0;
          local_288.c = 0;
          local_288.allocator = (Allocator *)0x0;
          local_288.dims = 0;
          local_288.w = 0;
          Mat::create(&local_288,i,4,(Allocator *)0x0);
          auVar37 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < local_288.c * (int)local_288.cstep) {
            auVar39 = vpbroadcastq_avx512f();
            auVar40 = vbroadcastss_avx512f
                                (ZEXT416(*(uint *)(*(long *)(&this->field_0x1f8 +
                                                            (long)this->
                                                  _vptr_ConvolutionDepthWise_x86_avx512[-3]) +
                                                  lVar34 * 4)));
            uVar31 = 0;
            do {
              auVar41 = vpbroadcastq_avx512f();
              auVar42 = vporq_avx512f(auVar41,auVar37);
              auVar41 = vporq_avx512f(auVar41,auVar38);
              uVar24 = vpcmpuq_avx512f(auVar41,auVar39,2);
              uVar25 = vpcmpuq_avx512f(auVar42,auVar39,2);
              bVar26 = (byte)uVar25;
              uVar36 = CONCAT11(bVar26,(byte)uVar24);
              puVar1 = (uint *)((long)local_288.data + uVar31 * 4);
              bVar35 = (bool)((byte)uVar24 & 1);
              bVar11 = (bool)((byte)(uVar36 >> 1) & 1);
              bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
              bVar13 = (bool)((byte)(uVar36 >> 3) & 1);
              bVar14 = (bool)((byte)(uVar36 >> 4) & 1);
              bVar15 = (bool)((byte)(uVar36 >> 5) & 1);
              bVar16 = (bool)((byte)(uVar36 >> 6) & 1);
              bVar17 = (bool)((byte)(uVar36 >> 7) & 1);
              bVar18 = (bool)(bVar26 >> 1 & 1);
              bVar19 = (bool)(bVar26 >> 2 & 1);
              bVar20 = (bool)(bVar26 >> 3 & 1);
              bVar21 = (bool)(bVar26 >> 4 & 1);
              bVar22 = (bool)(bVar26 >> 5 & 1);
              bVar23 = (bool)(bVar26 >> 6 & 1);
              *puVar1 = (uint)bVar35 * auVar40._0_4_ | (uint)!bVar35 * *puVar1;
              puVar1[1] = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * puVar1[1];
              puVar1[2] = (uint)bVar12 * auVar40._8_4_ | (uint)!bVar12 * puVar1[2];
              puVar1[3] = (uint)bVar13 * auVar40._12_4_ | (uint)!bVar13 * puVar1[3];
              puVar1[4] = (uint)bVar14 * auVar40._16_4_ | (uint)!bVar14 * puVar1[4];
              puVar1[5] = (uint)bVar15 * auVar40._20_4_ | (uint)!bVar15 * puVar1[5];
              puVar1[6] = (uint)bVar16 * auVar40._24_4_ | (uint)!bVar16 * puVar1[6];
              puVar1[7] = (uint)bVar17 * auVar40._28_4_ | (uint)!bVar17 * puVar1[7];
              puVar1[8] = (uint)(bVar26 & 1) * auVar40._32_4_ |
                          (uint)!(bool)(bVar26 & 1) * puVar1[8];
              puVar1[9] = (uint)bVar18 * auVar40._36_4_ | (uint)!bVar18 * puVar1[9];
              puVar1[10] = (uint)bVar19 * auVar40._40_4_ | (uint)!bVar19 * puVar1[10];
              puVar1[0xb] = (uint)bVar20 * auVar40._44_4_ | (uint)!bVar20 * puVar1[0xb];
              puVar1[0xc] = (uint)bVar21 * auVar40._48_4_ | (uint)!bVar21 * puVar1[0xc];
              puVar1[0xd] = (uint)bVar22 * auVar40._52_4_ | (uint)!bVar22 * puVar1[0xd];
              puVar1[0xe] = (uint)bVar23 * auVar40._56_4_ | (uint)!bVar23 * puVar1[0xe];
              puVar1[0xf] = (uint)(bVar26 >> 7) * auVar40._60_4_ |
                            (uint)!(bool)(bVar26 >> 7) * puVar1[0xf];
              uVar31 = uVar31 + 0x10;
            } while ((local_288.c * (int)local_288.cstep + 0xfU & 0xfffffff0) != uVar31);
          }
          piVar8 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          if (piStack_1a0 != (int *)0x0) {
            LOCK();
            *piStack_1a0 = *piStack_1a0 + -1;
            UNLOCK();
            if (*piStack_1a0 == 0) {
              if (local_188 == (Allocator *)0x0) {
                if (local_1a8 != (void *)0x0) {
                  free(local_1a8);
                }
              }
              else {
                (*local_188->_vptr_Allocator[3])();
              }
            }
          }
          piStack_1a0 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_1a8 = local_288.data;
          local_198 = local_288.elemsize;
          local_190 = local_288.elempack;
          local_188 = local_288.allocator;
          local_180 = CONCAT44(local_288.w,local_288.dims);
          uStack_178._0_4_ = local_288.h;
          uStack_178._4_4_ = local_288.d;
          local_170 = local_288.c;
          local_168 = local_288.cstep;
          p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
          lVar29 = *(long *)(&this->field_0x250 + (long)p_Var30);
          pvVar33 = (void *)(lVar29 * lVar34 + *(long *)(&this->field_0x240 + (long)p_Var30));
          uVar5 = *(undefined4 *)(&this->field_0x258 + (long)p_Var30);
          plVar6 = *(long **)(&this->field_0x260 + (long)p_Var30);
          if (piStack_158 != (int *)0x0) {
            LOCK();
            *piStack_158 = *piStack_158 + -1;
            UNLOCK();
            if (*piStack_158 == 0) {
              if (local_140 == (long *)0x0) {
                if (local_160 != (void *)0x0) {
                  free(local_160);
                }
              }
              else {
                (**(code **)(*local_140 + 0x18))();
              }
            }
          }
          piStack_158 = (int *)0x0;
          local_138 = 1;
          uStack_134 = 1;
          uStack_130 = 1;
          uStack_12c = 1;
          local_128 = 1;
          local_120 = 1;
          piVar8 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
          local_160 = pvVar33;
          lStack_150 = lVar29;
          uStack_148 = uVar5;
          local_140 = plVar6;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              if (local_288.allocator == (Allocator *)0x0) {
                if (local_288.data != (void *)0x0) {
                  free(local_288.data);
                }
              }
              else {
                (*(local_288.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
        }
        if (100 < *(int *)(&this->field_0x10c + (long)p_Var30)) {
          lVar29 = *(long *)(&this->field_0x298 + (long)p_Var30);
          lVar7 = *(long *)(&this->field_0x288 + (long)p_Var30);
          uVar5 = *(undefined4 *)(&this->field_0x2a0 + (long)p_Var30);
          plVar6 = *(long **)(&this->field_0x2a8 + (long)p_Var30);
          if (piStack_110 != (int *)0x0) {
            LOCK();
            *piStack_110 = *piStack_110 + -1;
            UNLOCK();
            if (*piStack_110 == 0) {
              if (local_f8 == (long *)0x0) {
                if (local_118 != (void *)0x0) {
                  free(local_118);
                }
              }
              else {
                (**(code **)(*local_f8 + 0x18))();
              }
            }
          }
          piStack_110 = (int *)0x0;
          local_f0 = 1;
          uStack_ec = 1;
          uStack_e8 = 1;
          uStack_e4 = 1;
          local_e0 = 1;
          local_d8 = 1;
          local_118 = (void *)(lVar29 * lVar34 + lVar7);
          lStack_108 = lVar29;
          uStack_100 = uVar5;
          local_f8 = plVar6;
        }
        ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_288,&local_238);
        (*pLVar28->_vptr_Layer[3])(pLVar28,&local_288);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_288);
        lVar29 = 0x120;
        do {
          piVar8 = *(int **)((long)&local_238.refcount + lVar29);
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + -1;
            UNLOCK();
            if (*piVar8 == 0) {
              pvVar33 = *(void **)((long)&local_238.data + lVar29);
              plVar6 = *(long **)((long)&local_238.allocator + lVar29);
              if (plVar6 == (long *)0x0) {
                if (pvVar33 != (void *)0x0) {
                  free(pvVar33);
                }
              }
              else {
                (**(code **)(*plVar6 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_238.cstep + lVar29) = 0;
          *(undefined1 (*) [16])((long)&local_238.refcount + lVar29 + 4) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_238.data + lVar29) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])((long)&local_238.dims + lVar29) = (undefined1  [16])0x0;
          *(undefined4 *)((long)&local_238.c + lVar29) = 0;
          lVar29 = lVar29 + -0x48;
        } while (lVar29 != -0x48);
      }
      (*pLVar28->_vptr_Layer[4])(pLVar28,local_38);
      (local_c8->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar34] = pLVar28;
      ParamDict::~ParamDict(&local_a8);
      if (local_98.refcount != (int *)0x0) {
        LOCK();
        *local_98.refcount = *local_98.refcount + -1;
        UNLOCK();
        if (*local_98.refcount == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (*(local_98.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar34 = lVar34 + 1;
      p_Var30 = this->_vptr_ConvolutionDepthWise_x86_avx512[-3];
    } while (lVar34 < *(int *)(&this->field_0x108 + (long)p_Var30));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g).clone();
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}